

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefTest(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Index IVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  Expression *ref;
  RefTest *pRVar5;
  bool local_99;
  HeapType local_50;
  HeapType local_48;
  uintptr_t local_40;
  uintptr_t local_38;
  Type local_30;
  Type castType;
  Type refType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  refType.id._4_4_ = 2;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&refType.id + 4));
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12a4,"Expression *wasm::TranslateToFuzzReader::makeRefTest(Type)");
  }
  bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
  local_99 = false;
  if (bVar1) {
    local_99 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x178));
  }
  if (local_99 == false) {
    __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12a5,"Expression *wasm::TranslateToFuzzReader::makeRefTest(Type)");
  }
  Type::Type(&castType);
  Type::Type(&local_30);
  IVar2 = upTo(this,3);
  if (IVar2 == 0) {
    local_38 = (uintptr_t)getReferenceType(this);
    castType.id = local_38;
    local_40 = (uintptr_t)getReferenceType(this);
    local_30 = (Type)local_40;
    local_48 = Type::getHeapType(&castType);
    BVar3 = HeapType::getBottom(&local_48);
    local_50 = Type::getHeapType(&local_30);
    BVar4 = HeapType::getBottom(&local_50);
    if (BVar3 == BVar4) goto LAB_001bfef8;
  }
  else if (IVar2 != 1) {
    if (IVar2 != 2) {
      wasm::handle_unreachable
                ("bad case",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x12c2);
    }
    local_30 = getReferenceType(this);
    castType = getSubType(this,local_30);
    goto LAB_001bfef8;
  }
  castType = getReferenceType(this);
  local_30 = getSubType(this,castType);
LAB_001bfef8:
  ref = make(this,castType);
  pRVar5 = Builder::makeRefTest(&this->builder,ref,local_30);
  return (Expression *)pRVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefTest(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  // The case of the reference and the cast type having a connection is useful,
  // so give a decent chance for one to be a subtype of the other.
  Type refType, castType;
  switch (upTo(3)) {
    case 0:
      // Totally random.
      refType = getReferenceType();
      castType = getReferenceType();
      // They must share a bottom type in order to validate.
      if (refType.getHeapType().getBottom() ==
          castType.getHeapType().getBottom()) {
        break;
      }
      // Otherwise, fall through and generate things in a way that is
      // guaranteed to validate.
      [[fallthrough]];
    case 1:
      // Cast is a subtype of ref.
      refType = getReferenceType();
      castType = getSubType(refType);
      break;
    case 2:
      // Ref is a subtype of cast.
      castType = getReferenceType();
      refType = getSubType(castType);
      break;
    default:
      // This unreachable avoids a warning on refType being possibly undefined.
      WASM_UNREACHABLE("bad case");
  }
  return builder.makeRefTest(make(refType), castType);
}